

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btLemkeAlgorithm.cpp
# Opt level: O1

bool __thiscall btLemkeAlgorithm::LexicographicPositive(btLemkeAlgorithm *this,btVectorXf *v)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  byte bVar4;
  btScalar bVar5;
  float fVar6;
  
  iVar1 = (v->m_storage).m_size;
  if (iVar1 < 2) {
    uVar2 = 0;
  }
  else {
    uVar2 = iVar1 - 1;
    uVar3 = 0;
    bVar4 = btMachEps()::calculated;
    bVar5 = btMachEps::machEps;
    do {
      if ((bVar4 & 1) == 0) {
        do {
          do {
            bVar5 = bVar5 * 0.5;
            fVar6 = bVar5 * 0.5 + 1.0;
          } while (fVar6 != 1.0);
        } while (NAN(fVar6));
        btMachEps()::calculated = 1;
        bVar4 = 1;
        btMachEps::machEps = bVar5;
      }
      if (bVar5 <= ABS((v->m_storage).m_data[uVar3])) {
        uVar2 = (uint)uVar3;
        break;
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 != uVar2);
  }
  return 0.0 < (v->m_storage).m_data[uVar2];
}

Assistant:

bool btLemkeAlgorithm::LexicographicPositive(const btVectorXu & v)
{
    int i = 0;
  //  if (DEBUGLEVEL)
    //  cout << "v " << v << endl;

    while(i < v.size()-1 && fabs(v[i]) < btMachEps())
      i++;
    if (v[i] > 0)
      return true;

    return false;
  }